

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
GEO::Delaunay3dThread::get_neighbor_along_conflict_zone_border
          (Delaunay3dThread *this,index_t t1,index_t t1fborder,index_t t1ft2,index_t *t2,
          index_t *t2fborder,index_t *t2ft1)

{
  signed_index_t v1;
  signed_index_t v2;
  uint t;
  pointer piVar1;
  index_t iVar2;
  uint *puVar3;
  ulong uVar4;
  index_t f21;
  index_t f12;
  index_t local_38;
  index_t local_34;
  
  piVar1 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  v1 = piVar1[(int)(char)halfedge_facet_[(ulong)t1fborder + (ulong)t1ft2 * 4] + t1 * 4];
  v2 = piVar1[(int)(char)halfedge_facet_[(ulong)t1ft2 + (ulong)t1fborder * 4] + t1 * 4];
  puVar3 = (uint *)((this->cell_to_cell_store_->
                    super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start + (t1ft2 + t1 * 4));
  uVar4 = (ulong)t1;
  while( true ) {
    t = *puVar3;
    if (((this->cell_thread_->
         super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>).
         super__Vector_base<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>.
         _M_impl.super__Vector_impl_data._M_start[t] & 1) == 0) break;
    t1ft2 = get_facet_by_halfedge(this,t,v1,v2);
    puVar3 = (uint *)((this->cell_to_cell_store_->
                      super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                      super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                      super__Vector_impl_data._M_start + (t1ft2 + t * 4));
    uVar4 = (ulong)t;
  }
  get_facets_by_halfedge(this,t,v1,v2,&local_34,&local_38);
  iVar2 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
          super__Vector_impl_data._M_start[local_38 + t * 4];
  *t2 = iVar2;
  iVar2 = find_tet_vertex(this,iVar2,
                          (this->cell_to_v_store_->
                          super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                          super__Vector_impl_data._M_start[t * 4 + local_34]);
  *t2ft1 = iVar2;
  *t2fborder = t1ft2;
  return *t2 != (index_t)uVar4;
}

Assistant:

bool get_neighbor_along_conflict_zone_border(
            index_t t1,
            index_t t1fborder,
            index_t t1ft2,
            index_t& t2,
            index_t& t2fborder,
            index_t& t2ft1
        ) const {
            
            // Note: this function is a bit long for an inline function,
            // but I observed a (modest) performance gain doing so.
            
            //   Find two vertices that are both on facets new_f and f1
            //  (the edge around which we are turning)
            //  This uses duality as follows:
            //  Primal form (not used here): 
            //    halfedge_facet_[v1][v2] returns a facet that is incident
            //    to both v1 and v2.
            //  Dual form (used here):
            //    halfedge_facet_[f1][f2] returns a vertex that both 
            //    f1 and f2 are incident to.
            signed_index_t ev1 = 
                tet_vertex(t1, index_t(halfedge_facet_[t1ft2][t1fborder]));
            signed_index_t ev2 = 
                tet_vertex(t1, index_t(halfedge_facet_[t1fborder][t1ft2]));
            
            //   Turn around edge [ev1,ev2] inside the conflict zone
            // until we reach again the boundary of the conflict zone.
            // Traversing inside the conflict zone is faster (as compared
            // to outside) since it traverses a smaller number of tets.
            index_t cur_t = t1;
            index_t cur_f = t1ft2;
            index_t next_t = index_t(tet_adjacent(cur_t,cur_f));
            while(tet_is_marked_as_conflict(next_t)) {            
                geo_debug_assert(next_t != t1);
                cur_t = next_t;
                cur_f = get_facet_by_halfedge(cur_t,ev1,ev2);
                next_t = index_t(tet_adjacent(cur_t, cur_f));
            }
             
            //  At this point, cur_t is in conflict zone and
            // next_t is outside the conflict zone.
            index_t f12,f21;
            get_facets_by_halfedge(next_t, ev1, ev2, f12, f21);
            t2 = index_t(tet_adjacent(next_t,f21));
            signed_index_t v_neigh_opposite = tet_vertex(next_t,f12);
            t2ft1 = find_tet_vertex(t2, v_neigh_opposite);
            t2fborder = cur_f;
            
            //  Test whether the found neighboring tet was created
            //  (then return true) or is an old tet in conflict
            //  (then return false).
            return(t2 != cur_t);
        }